

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O0

Pos_index * __thiscall
Gudhi::persistence_matrix::
Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
::_birth(Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
         *this,Pos_index simplexIndex)

{
  reference pvVar1;
  reference pvVar2;
  Pos_index simplexIndex_local;
  Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
  *this_local;
  
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                     (&(this->
                       super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
                       ).indexToBar_,(ulong)simplexIndex);
  pvVar2 = std::
           vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
           ::at((vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                 *)this,(ulong)*pvVar1);
  return &pvVar2->birth;
}

Assistant:

Pos_index& _birth(Pos_index simplexIndex) {
    if constexpr (Master_matrix::Option_list::has_removable_columns) {
      return CP::indexToBar_.at(simplexIndex)->birth;
    } else {
      return CP::barcode_.at(CP::indexToBar_.at(simplexIndex)).birth;
    }
  }